

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68k-dis.c
# Opt level: O2

void print_base(int regno,int disp,disassemble_info *info)

{
  char buf [50];
  char acStack_58 [64];
  
  if (regno != -1) {
    sprintf(acStack_58,"%d");
    (*info->fprintf_func)(info->stream,"%s",acStack_58);
    if (regno != -2) {
      if (regno == -3) {
        (*info->fprintf_func)(info->stream,",zpc");
      }
      else {
        (*info->fprintf_func)(info->stream,",%s",reg_names[regno]);
      }
    }
    return;
  }
  (*info->fprintf_func)(info->stream,"%d",disp);
  (*info->fprintf_func)(info->stream,",pc");
  return;
}

Assistant:

static void
// print_base (int regno, bfd_vma disp, disassemble_info *info)
print_base (int regno, int disp, disassemble_info *info) // DIRK: Made signed
{
  if (regno == -1)
    {
#ifdef MOTOROLA
      // (*info->print_address_func) (disp, info); // DIRK: Commented out
      (*info->fprintf_func) (info->stream, "%d", disp); // DIRK: Added
      (*info->fprintf_func) (info->stream, ",pc");
#else
      (*info->fprintf_func) (info->stream, "%%pc@(");
      // (*info->print_address_func) (disp, info); // DIRK: Commented out
      (*info->fprintf_func) (info->stream, "%d", disp); // DIRK: Added
#endif
    }
  else
    {
      char buf[50];

#ifdef TARGET_AMIGA
      #if 0
      /* Dump the symbol instead of the number*/
      if (dump_baserel && regno == 12)
	{
	  static int offset;

      #if 0 
	  /* Swap section to .data */
	  struct objdump_disasm_info *aux =
	      (struct objdump_disasm_info *) info->application_data;
	  asection * text = aux->sec;
	  aux->sec = text->next;
      #endif

	  /* Try handling a4 set to 0 or set to -0x7ffe.
	   * TODO: search the correct offset via lea statement.
	   */
	  if (disp & 0x80000000)
	    offset = 0x7ffe;
	  (*info->print_address_func) (disp + offset, info);

	  /* restore section to .text */
	  aux->sec = text;
	}
      else
    #endif
	{
	  sprintf_vma (buf, disp);
          (*info->fprintf_func) (info->stream, "%s", buf);
	}
#endif
#ifdef MOTOROLA
      if (regno == -2)
	;
      else if (regno == -3)
	(*info->fprintf_func) (info->stream, ",zpc");
      else
	(*info->fprintf_func) (info->stream, ",%s", reg_names[regno]);
#else
      if (regno == -2)
	(*info->fprintf_func) (info->stream, "@(");
      else if (regno == -3)
	(*info->fprintf_func) (info->stream, "%%zpc@(");
      else
	(*info->fprintf_func) (info->stream, "%s@(", reg_names[regno]);
#endif

#ifndef TARGET_AMIGA
      sprintf_vma (buf, disp);
      (*info->fprintf_func) (info->stream, "%s", buf);
#endif
    }
}